

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdk.cpp
# Opt level: O0

float SDK::distanceTo(Vec2 start,Vec2 end)

{
  bool bVar1;
  reference pvVar2;
  ulong uVar3;
  size_type sVar4;
  reference b;
  float fVar5;
  Vec2 local_70;
  int local_68;
  int i;
  Vec2 local_58;
  float local_50;
  undefined4 local_4c;
  float res;
  Vec2 local_40;
  undefined1 local_38 [8];
  vector<Vec2,_std::allocator<Vec2>_> path;
  Vec2 end_local;
  Vec2 start_local;
  
  _res = end;
  local_40 = start;
  unique0x100001e7 = end;
  end_local = start;
  routeTo((vector<Vec2,_std::allocator<Vec2>_> *)local_38,start,end);
  bVar1 = std::vector<Vec2,_std::allocator<Vec2>_>::empty
                    ((vector<Vec2,_std::allocator<Vec2>_> *)local_38);
  if (bVar1) {
    start_local.x = 1e+08;
  }
  else {
    pvVar2 = std::vector<Vec2,_std::allocator<Vec2>_>::operator[]
                       ((vector<Vec2,_std::allocator<Vec2>_> *)local_38,0);
    local_58 = Vec2::operator-(pvVar2,&end_local);
    local_50 = Vec2::length(&local_58);
    local_68 = 1;
    while( true ) {
      uVar3 = (ulong)local_68;
      sVar4 = std::vector<Vec2,_std::allocator<Vec2>_>::size
                        ((vector<Vec2,_std::allocator<Vec2>_> *)local_38);
      if (sVar4 <= uVar3) break;
      pvVar2 = std::vector<Vec2,_std::allocator<Vec2>_>::operator[]
                         ((vector<Vec2,_std::allocator<Vec2>_> *)local_38,(long)local_68);
      b = std::vector<Vec2,_std::allocator<Vec2>_>::operator[]
                    ((vector<Vec2,_std::allocator<Vec2>_> *)local_38,(long)(local_68 + -1));
      local_70 = Vec2::operator-(pvVar2,b);
      fVar5 = Vec2::length(&local_70);
      local_50 = fVar5 + local_50;
      local_68 = local_68 + 1;
    }
    start_local.x = local_50;
  }
  local_4c = 1;
  std::vector<Vec2,_std::allocator<Vec2>_>::~vector((vector<Vec2,_std::allocator<Vec2>_> *)local_38)
  ;
  return start_local.x;
}

Assistant:

float SDK::distanceTo(Vec2 start, Vec2 end)
{
    auto path = routeTo(start, end);
    if (path.empty())
        return FINF;
    float res = (path[0] - start).length();
    for (int i = 1; i < path.size(); ++i)
        res += (path[i] - path[i - 1]).length();
    return res;
}